

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

int queryStrItem(void *userData,char *queryItemKey,size_t queryItemKeyLen,char *queryItemValue,
                size_t queryItemValueLen)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  IResultCapture *pIVar5;
  ExpressionResultBuilder *pEVar6;
  undefined8 uVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  mapped_type *this_00;
  allocator local_d89;
  key_type local_d88;
  allocator local_d61;
  string local_d60 [39];
  undefined1 local_d39;
  undefined1 local_d38 [7];
  bool this_is_here_to_invoke_warnings_3;
  uint local_b10;
  allocator<char> local_b09;
  Value internal_catch_action_3;
  allocator<char> local_ae1;
  string local_ae0;
  SourceLineInfo local_ac0;
  allocator<char> local_a91;
  string local_a90;
  undefined1 local_a70 [8];
  AssertionInfo __assertionInfo217;
  undefined1 local_9f8 [7];
  bool this_is_here_to_invoke_warnings_2;
  uint local_7d0;
  allocator<char> local_7c9;
  Value internal_catch_action_2;
  allocator<char> local_7a1;
  string local_7a0;
  SourceLineInfo local_780;
  allocator<char> local_751;
  string local_750;
  undefined1 local_730 [8];
  AssertionInfo __assertionInfo216;
  undefined1 local_6b8 [7];
  bool this_is_here_to_invoke_warnings_1;
  uint local_490;
  allocator<char> local_489;
  Value internal_catch_action_1;
  allocator<char> local_461;
  string local_460;
  SourceLineInfo local_440;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionInfo __assertionInfo213;
  undefined1 local_378 [7];
  bool this_is_here_to_invoke_warnings;
  uint local_150;
  allocator<char> local_149;
  Value internal_catch_action;
  allocator<char> local_121;
  string local_120;
  SourceLineInfo local_100;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  AssertionInfo __assertionInfo212;
  size_t queryItemValueLen_local;
  char *queryItemValue_local;
  size_t queryItemKeyLen_local;
  char *queryItemKey_local;
  void *userData_local;
  
  __assertionInfo212._104_8_ = queryItemValueLen;
  queryItemValueLen_local = (size_t)queryItemValue;
  queryItemValue_local = (char *)queryItemKeyLen;
  queryItemKeyLen_local = (size_t)queryItemKey;
  queryItemKey_local = (char *)userData;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"CAPTURE",&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_121);
    Catch::SourceLineInfo::SourceLineInfo(&local_100,&local_120,0xd4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action,"",&local_149);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_a0,&local_c0,&local_100,(string *)&internal_catch_action,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action);
    std::allocator<char>::~allocator(&local_149);
    Catch::SourceLineInfo::~SourceLineInfo(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pIVar5 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_378,Info);
    pEVar6 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_378,(char (*) [17])"queryItemKey := ");
    pEVar6 = Catch::ExpressionResultBuilder::operator<<(pEVar6,(char **)&queryItemKeyLen_local);
    uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_a0);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_378);
    local_150 = uVar4;
    if (uVar4 != 0) {
      if ((uVar4 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_150 & 4) != 0) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::shouldContinueOnFailure(1);
      if (!bVar3) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::isTrue(false);
      if (bVar3) {
        __assertionInfo213._111_1_ = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_a0);
    bVar3 = Catch::isTrue(false);
  } while (bVar3);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"CAPTURE",&local_411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_461);
    Catch::SourceLineInfo::SourceLineInfo(&local_440,&local_460,0xd5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action_1,"",&local_489);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_3f0,&local_410,&local_440,(string *)&internal_catch_action_1,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action_1);
    std::allocator<char>::~allocator(&local_489);
    Catch::SourceLineInfo::~SourceLineInfo(&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator(&local_461);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    pIVar5 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_6b8,Info);
    pEVar6 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_6b8,(char (*) [20])"queryItemKeyLen := ");
    pEVar6 = Catch::ExpressionResultBuilder::operator<<
                       (pEVar6,(unsigned_long *)&queryItemValue_local);
    uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_3f0);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_6b8);
    local_490 = uVar4;
    if (uVar4 != 0) {
      if ((uVar4 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_490 & 4) != 0) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::shouldContinueOnFailure(1);
      if (!bVar3) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::isTrue(false);
      if (bVar3) {
        __assertionInfo216._111_1_ = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_3f0);
    bVar3 = Catch::isTrue(false);
  } while (bVar3);
  if (queryItemValueLen_local != 0) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"CAPTURE",&local_751);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
                 ,&local_7a1);
      Catch::SourceLineInfo::SourceLineInfo(&local_780,&local_7a0,0xd8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&internal_catch_action_2,"",&local_7c9);
      Catch::AssertionInfo::AssertionInfo
                ((AssertionInfo *)local_730,&local_750,&local_780,(string *)&internal_catch_action_2
                 ,ContinueOnFailure);
      std::__cxx11::string::~string((string *)&internal_catch_action_2);
      std::allocator<char>::~allocator(&local_7c9);
      Catch::SourceLineInfo::~SourceLineInfo(&local_780);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator(&local_7a1);
      std::__cxx11::string::~string((string *)&local_750);
      std::allocator<char>::~allocator(&local_751);
      pIVar5 = Catch::getResultCapture();
      Catch::ExpressionResultBuilder::ExpressionResultBuilder
                ((ExpressionResultBuilder *)local_9f8,Info);
      pEVar6 = Catch::ExpressionResultBuilder::operator<<
                         ((ExpressionResultBuilder *)local_9f8,(char (*) [19])"queryItemValue := ");
      pEVar6 = Catch::ExpressionResultBuilder::operator<<(pEVar6,(char **)&queryItemValueLen_local);
      uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_730);
      Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_9f8)
      ;
      local_7d0 = uVar4;
      if (uVar4 != 0) {
        if ((uVar4 & 2) != 0) {
          BreakIntoDebugger();
        }
        if ((local_7d0 & 4) != 0) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
        }
        bVar3 = Catch::shouldContinueOnFailure(1);
        if (!bVar3) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
        }
        bVar3 = Catch::isTrue(false);
        if (bVar3) {
          __assertionInfo217._111_1_ = 1;
          Catch::isTrue(true);
        }
      }
      Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_730);
      bVar3 = Catch::isTrue(false);
    } while (bVar3);
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"CAPTURE",&local_a91);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
                 ,&local_ae1);
      Catch::SourceLineInfo::SourceLineInfo(&local_ac0,&local_ae0,0xd9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&internal_catch_action_3,"",&local_b09);
      Catch::AssertionInfo::AssertionInfo
                ((AssertionInfo *)local_a70,&local_a90,&local_ac0,(string *)&internal_catch_action_3
                 ,ContinueOnFailure);
      std::__cxx11::string::~string((string *)&internal_catch_action_3);
      std::allocator<char>::~allocator(&local_b09);
      Catch::SourceLineInfo::~SourceLineInfo(&local_ac0);
      std::__cxx11::string::~string((string *)&local_ae0);
      std::allocator<char>::~allocator(&local_ae1);
      std::__cxx11::string::~string((string *)&local_a90);
      std::allocator<char>::~allocator(&local_a91);
      pIVar5 = Catch::getResultCapture();
      Catch::ExpressionResultBuilder::ExpressionResultBuilder
                ((ExpressionResultBuilder *)local_d38,Info);
      pEVar6 = Catch::ExpressionResultBuilder::operator<<
                         ((ExpressionResultBuilder *)local_d38,
                          (char (*) [22])"queryItemValueLen := ");
      pEVar6 = Catch::ExpressionResultBuilder::operator<<
                         (pEVar6,(unsigned_long *)&__assertionInfo212.resultDisposition);
      uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_a70);
      Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_d38)
      ;
      local_b10 = uVar4;
      if (uVar4 != 0) {
        if ((uVar4 & 2) != 0) {
          BreakIntoDebugger();
        }
        if ((local_b10 & 4) != 0) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
        }
        bVar3 = Catch::shouldContinueOnFailure(1);
        if (!bVar3) {
          uVar7 = __cxa_allocate_exception(1);
          __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
        }
        bVar3 = Catch::isTrue(false);
        if (bVar3) {
          local_d39 = 1;
          Catch::isTrue(true);
        }
      }
      Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_a70);
      bVar3 = Catch::isTrue(false);
    } while (bVar3);
  }
  sVar1 = queryItemValueLen_local;
  uVar7 = __assertionInfo212._104_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d60,(char *)sVar1,uVar7,&local_d61);
  sVar1 = queryItemKeyLen_local;
  pcVar2 = queryItemValue_local;
  this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(queryItemKey_local + 0x120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d88,(char *)sVar1,(ulong)pcVar2,&local_d89);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this,&local_d88);
  std::__cxx11::string::operator=((string *)this_00,local_d60);
  std::__cxx11::string::~string((string *)&local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator((allocator<char> *)&local_d61);
  return 1;
}

Assistant:

inline int queryStrItem(void* userData, const char* queryItemKey, size_t queryItemKeyLen, const char* queryItemValue, size_t queryItemValueLen)
{
    CAPTURE(queryItemKey);
    CAPTURE(queryItemKeyLen);
    if (queryItemValue)
    {
        CAPTURE(queryItemValue);
        CAPTURE(queryItemValueLen);
    }
    static_cast<URI*>(userData)->queryStrItems[std::string(queryItemKey,queryItemKeyLen)] = std::string(queryItemValue, queryItemValueLen);
    return 1;
}